

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_issuer_source_sync_unittest.h
# Opt level: O0

bool __thiscall
bssl::CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>::
IssuersMatch(CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>
             *this,shared_ptr<const_bssl::ParsedCertificate> *cert,
            ParsedCertificateList *expected_matches)

{
  bool bVar1;
  CertIssuerSource *pCVar2;
  element_type *peVar3;
  iterator iVar4;
  element_type *peVar5;
  iterator __last;
  char *message;
  Span<const_unsigned_char> SVar6;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  Span<const_unsigned_char> local_f0;
  __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_e0;
  shared_ptr<const_bssl::ParsedCertificate> *it_1;
  iterator __end2_1;
  iterator __begin2_1;
  ParsedCertificateList *__range2_1;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> der_expected_matches;
  Span<const_unsigned_char> local_98;
  __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_88;
  shared_ptr<const_bssl::ParsedCertificate> *it;
  iterator __end2;
  iterator __begin2;
  ParsedCertificateList *__range2;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> der_result_matches;
  undefined1 local_40 [8];
  ParsedCertificateList matches;
  ParsedCertificateList *expected_matches_local;
  shared_ptr<const_bssl::ParsedCertificate> *cert_local;
  CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>
  *this_local;
  
  matches.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)expected_matches;
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            *)local_40);
  pCVar2 = source(this);
  peVar3 = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::get
                     (&cert->
                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                     );
  (*pCVar2->_vptr_CertIssuerSource[2])(pCVar2,peVar3,local_40);
  ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::vector
            ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2);
  __end2 = ::std::
           vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           ::begin((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                    *)local_40);
  it = (shared_ptr<const_bssl::ParsedCertificate> *)
       ::std::
       vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
       ::end((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
              *)local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<const_bssl::ParsedCertificate>_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_>
                                *)&it);
    if (!bVar1) break;
    local_88 = (__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<const_bssl::ParsedCertificate>_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_>
                  ::operator*(&__end2);
    peVar5 = ::std::
             __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_88);
    SVar6 = (Span<const_unsigned_char>)ParsedCertificate::der_cert(peVar5);
    local_98 = SVar6;
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
              ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2,
               (value_type *)&local_98);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_bssl::ParsedCertificate>_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_>
    ::operator++(&__end2);
  }
  iVar4 = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::begin
                    ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2);
  der_expected_matches.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::end
                          ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2)
  ;
  ::std::
  sort<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>
            ((__normal_iterator<bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
              )iVar4._M_current,
             (__normal_iterator<bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
              )der_expected_matches.
               super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::vector
            ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2_1);
  __end2_1 = ::std::
             vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             ::begin(expected_matches);
  it_1 = (shared_ptr<const_bssl::ParsedCertificate> *)
         ::std::
         vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
         ::end(expected_matches);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<std::shared_ptr<const_bssl::ParsedCertificate>_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_>
                        *)&it_1);
    if (!bVar1) break;
    local_e0 = (__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<const_bssl::ParsedCertificate>_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_>
                  ::operator*(&__end2_1);
    peVar5 = ::std::
             __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_e0);
    SVar6 = (Span<const_unsigned_char>)ParsedCertificate::der_cert(peVar5);
    local_f0 = SVar6;
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
              ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2_1,
               (value_type *)&local_f0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_bssl::ParsedCertificate>_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_>
    ::operator++(&__end2_1);
  }
  iVar4 = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::begin
                    ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2_1);
  __last = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::end
                     ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2_1);
  ::std::
  sort<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>>
            ((__normal_iterator<bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
              )iVar4._M_current,
             (__normal_iterator<bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
              )__last._M_current);
  bVar1 = ::std::operator==((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                            &__range2_1,
                            (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2
                           );
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    testing::internal::EqHelper::
    Compare<std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_nullptr>
              ((EqHelper *)local_118,"der_expected_matches","der_result_matches",
               (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2_1,
               (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/cert_issuer_source_sync_unittest.h"
                 ,0x7d,message);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    this_local._7_1_ = false;
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 1;
  ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~vector
            ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2_1);
  ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~vector
            ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&__range2);
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             *)local_40);
  return this_local._7_1_;
}

Assistant:

bool IssuersMatch(std::shared_ptr<const ParsedCertificate> cert,
                    ParsedCertificateList expected_matches) {
    ParsedCertificateList matches;
    source().SyncGetIssuersOf(cert.get(), &matches);

    std::vector<der::Input> der_result_matches;
    for (const auto &it : matches) {
      der_result_matches.push_back(it->der_cert());
    }
    std::sort(der_result_matches.begin(), der_result_matches.end());

    std::vector<der::Input> der_expected_matches;
    for (const auto &it : expected_matches) {
      der_expected_matches.push_back(it->der_cert());
    }
    std::sort(der_expected_matches.begin(), der_expected_matches.end());

    if (der_expected_matches == der_result_matches) {
      return true;
    }

    // Print some extra information for debugging.
    EXPECT_EQ(der_expected_matches, der_result_matches);
    return false;
  }